

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void open_blocked_streams(quicly_conn_t *conn,int uni)

{
  st_quicly_linklist_t *psVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  quicly_stream_t *stream;
  quicly_linklist_t *anchor;
  uint64_t count;
  quicly_stream_t *stream_00;
  quicly_linklist_t *local_20;
  ulong local_18;
  
  if (in_ESI == 0) {
    local_18 = *(ulong *)(in_RDI + 0x6c8);
    local_20 = (quicly_linklist_t *)(in_RDI + 0x798);
  }
  else {
    local_18 = *(ulong *)(in_RDI + 0x6a0);
    local_20 = (quicly_linklist_t *)(in_RDI + 0x788);
  }
  while ((iVar2 = quicly_linklist_is_linked(local_20), iVar2 != 0 &&
         (psVar1 = local_20->next, (ulong)((long)psVar1[-0x10].next / 4) < local_18))) {
    if (((ulong)psVar1[-5].next & 1) == 0) {
      __assert_fail("stream->streams_blocked",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xe86,"void open_blocked_streams(quicly_conn_t *, int)");
    }
    quicly_linklist_unlink((quicly_linklist_t *)0x14980b);
    *(byte *)&psVar1[-5].next = *(byte *)&psVar1[-5].next & 0xfe;
    iVar2 = quicly_stream_is_unidirectional((quicly_stream_id_t)psVar1[-0x10].next);
    if (iVar2 == 0) {
      stream_00 = *(quicly_stream_t **)(in_RDI + 0x298);
    }
    else {
      stream_00 = *(quicly_stream_t **)(in_RDI + 0x2a0);
    }
    psVar1[-4].prev = (st_quicly_linklist_t *)stream_00;
    sched_stream_control((quicly_stream_t *)0x149874);
    resched_stream_data(stream_00);
  }
  return;
}

Assistant:

static void open_blocked_streams(quicly_conn_t *conn, int uni)
{
    uint64_t count;
    quicly_linklist_t *anchor;

    if (uni) {
        count = conn->egress.max_streams.uni.count;
        anchor = &conn->egress.pending_streams.blocked.uni;
    } else {
        count = conn->egress.max_streams.bidi.count;
        anchor = &conn->egress.pending_streams.blocked.bidi;
    }

    while (quicly_linklist_is_linked(anchor)) {
        quicly_stream_t *stream = (void *)((char *)anchor->next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if (stream->stream_id / 4 >= count)
            break;
        assert(stream->streams_blocked);
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
        stream->streams_blocked = 0;
        stream->_send_aux.max_stream_data = quicly_stream_is_unidirectional(stream->stream_id)
                                                ? conn->super.remote.transport_params.max_stream_data.uni
                                                : conn->super.remote.transport_params.max_stream_data.bidi_remote;
        /* TODO retain separate flags for stream states so that we do not always need to sched for both control and data */
        sched_stream_control(stream);
        resched_stream_data(stream);
    }
}